

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASEParser.cpp
# Opt level: O2

void __thiscall Assimp::ASE::Parser::ParseLV3ScaleAnimationBlock(Parser *this,Animation *anim)

{
  byte bVar1;
  pointer paVar2;
  bool bVar3;
  bool bVar4;
  byte *pbVar5;
  int iVar6;
  uint iIndex;
  aiVectorKey local_48;
  
  pbVar5 = (byte *)this->filePtr;
  iVar6 = 0;
  do {
    if (*pbVar5 == 0x2a) {
      this->filePtr = (char *)(pbVar5 + 1);
      bVar3 = TokenMatch<char_const>(&this->filePtr,"CONTROL_SCALE_SAMPLE",0x14);
      if (bVar3) {
        anim->mScalingType = TRACK;
      }
      bVar4 = TokenMatch<char_const>(&this->filePtr,"CONTROL_BEZIER_SCALE_KEY",0x18);
      if (bVar4) {
        anim->mScalingType = BEZIER;
        bVar3 = true;
      }
      bVar4 = TokenMatch<char_const>(&this->filePtr,"CONTROL_TCB_SCALE_KEY",0x15);
      if (bVar4) {
        anim->mScalingType = TCB;
      }
      else if (bVar3 == false) goto LAB_003e18ea;
      local_48.mTime = 0.0;
      local_48.mValue.x = 0.0;
      local_48.mValue.y = 0.0;
      local_48.mValue.z = 0.0;
      std::vector<aiVectorKey,_std::allocator<aiVectorKey>_>::emplace_back<aiVectorKey>
                (&anim->akeyScaling,&local_48);
      paVar2 = (anim->akeyScaling).super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      ParseLV4MeshFloatTriple(this,&paVar2[-1].mValue.x,&iIndex);
      paVar2[-1].mTime = (double)iIndex;
    }
LAB_003e18ea:
    pbVar5 = (byte *)this->filePtr;
    bVar1 = *pbVar5;
    if ((bVar1 - 0xc < 2) || (bVar1 == 10)) {
      if (this->bLastWasEndLine != false) goto LAB_003e1928;
      this->iLineNumber = this->iLineNumber + 1;
      bVar3 = true;
    }
    else {
      if (bVar1 == 0x7b) {
        iVar6 = iVar6 + 1;
      }
      else if (bVar1 == 0x7d) {
        iVar6 = iVar6 + -1;
        if (iVar6 == 0) {
          this->filePtr = (char *)(pbVar5 + 1);
          SkipToNextToken(this);
          return;
        }
      }
      else if (bVar1 == 0) {
        LogError(this,
                 "Encountered unexpected EOL while parsing a *CONTROL_POS_TRACK chunk (Level 3)");
      }
LAB_003e1928:
      bVar3 = false;
    }
    this->bLastWasEndLine = bVar3;
    pbVar5 = pbVar5 + 1;
    this->filePtr = (char *)pbVar5;
  } while( true );
}

Assistant:

void Parser::ParseLV3ScaleAnimationBlock(ASE::Animation& anim)
{
    AI_ASE_PARSER_INIT();
    unsigned int iIndex;

    while (true)
    {
        if ('*' == *filePtr)
        {
            ++filePtr;

            bool b = false;

            // For the moment we're just reading the three floats -
            // we ignore the additional information for bezier's and TCBs

            // simple scaling keyframe
            if (TokenMatch(filePtr,"CONTROL_SCALE_SAMPLE" ,20))
            {
                b = true;
                anim.mScalingType = ASE::Animation::TRACK;
            }

            // Bezier scaling keyframe
            if (TokenMatch(filePtr,"CONTROL_BEZIER_SCALE_KEY" ,24))
            {
                b = true;
                anim.mScalingType = ASE::Animation::BEZIER;
            }
            // TCB scaling keyframe
            if (TokenMatch(filePtr,"CONTROL_TCB_SCALE_KEY" ,21))
            {
                b = true;
                anim.mScalingType = ASE::Animation::TCB;
            }
            if (b)
            {
                anim.akeyScaling.push_back(aiVectorKey());
                aiVectorKey& key = anim.akeyScaling.back();
                ParseLV4MeshFloatTriple(&key.mValue.x,iIndex);
                key.mTime = (double)iIndex;
            }
        }
        AI_ASE_HANDLE_SECTION("3","*CONTROL_POS_TRACK");
    }
}